

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O0

void sunStopTiming(sunTimerStruct *entry)

{
  long *in_RDI;
  long ns_difference;
  long s_difference;
  long local_18;
  long local_10;
  
  sunclock_gettime_monotonic((sunTimespec *)0x112ff8);
  local_10 = *(long *)in_RDI[1] - *(long *)*in_RDI;
  local_18 = *(long *)(in_RDI[1] + 8) - *(long *)(*in_RDI + 8);
  if (local_18 < 0) {
    local_10 = local_10 + -1;
    local_18 = (*(long *)(in_RDI[1] + 8) + 1000000000) - *(long *)(*in_RDI + 8);
  }
  in_RDI[4] = (long)((double)local_18 * 1e-09 + (double)local_10 + (double)in_RDI[4]);
  in_RDI[2] = in_RDI[4];
  in_RDI[3] = in_RDI[4];
  return;
}

Assistant:

static void sunStopTiming(sunTimerStruct* entry)
{
  long s_difference  = 0;
  long ns_difference = 0;

  sunclock_gettime_monotonic(entry->toc);

  s_difference  = entry->toc->tv_sec - entry->tic->tv_sec;
  ns_difference = entry->toc->tv_nsec - entry->tic->tv_nsec;
  if (ns_difference < 0)
  {
    s_difference--;
    ns_difference = 1000000000 + entry->toc->tv_nsec - entry->tic->tv_nsec;
  }

  entry->elapsed += ((double)s_difference) + ((double)ns_difference) * 1e-9;
  entry->average = entry->elapsed;
  entry->maximum = entry->elapsed;
}